

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

Term ** array_new<Kernel::Term*>(void *placement,size_t length)

{
  size_t sVar1;
  Term **res;
  
  for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
    *(undefined8 *)((long)placement + sVar1 * 8) = 0;
  }
  return (Term **)placement;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}